

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenDataDrop(BinaryenModuleRef module,char *segment)

{
  IString *this;
  DataDrop *this_00;
  undefined1 in_CL;
  string_view sVar1;
  
  this = (IString *)strlen(segment);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)segment;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
  this_00 = (DataDrop *)MixedArena::allocSpace(&module->allocator,0x20,8);
  *(undefined8 *)&(this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression = 0
  ;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str._M_str = (char *)0x0;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression._id = DataDropId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str = sVar1;
  wasm::DataDrop::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenDataDrop(BinaryenModuleRef module,
                                       const char* segment) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeDataDrop(Name(segment)));
}